

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O3

int ffcins(fitsfile *fptr,LONGLONG naxis1,LONGLONG naxis2,LONGLONG ninsert,LONGLONG bytepos,
          int *status)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  size_t __n;
  long lVar4;
  ulong uVar5;
  long lVar6;
  FITSfile *pFVar7;
  long lVar8;
  LONGLONG LVar9;
  long lVar10;
  long lVar11;
  LONGLONG nchars;
  bool bVar12;
  uchar buffer [10000];
  uchar local_2748 [10008];
  
  iVar2 = *status;
  if (naxis2 != 0 && iVar2 < 1) {
    pFVar7 = fptr->Fptr;
    bVar1 = (pFVar7->hdutype == 1) << 5;
    lVar4 = ninsert + naxis1;
    if (lVar4 < 0x2711) {
      if (0 < ninsert) {
        memset(local_2748,(uint)bVar1,ninsert);
      }
      lVar8 = bytepos + 1;
      lVar3 = pFVar7->heapstart + pFVar7->datastart;
      if (pFVar7->logfilesize < lVar3) {
        pFVar7->logfilesize = ((lVar3 + 0xb3f) / 0xb40) * 0xb40;
      }
      ffgtbb(fptr,naxis2,lVar8,naxis1 - bytepos,local_2748 + ninsert,status);
      fptr->Fptr->rowlength = lVar4;
      ffptbb(fptr,naxis2,lVar8,(naxis1 - bytepos) + ninsert,local_2748,status);
      fptr->Fptr->rowlength = naxis1;
      if (1 < naxis2) {
        uVar5 = naxis2 + 1;
        do {
          ffgtbb(fptr,uVar5 - 2,lVar8,naxis1,local_2748 + ninsert,status);
          fptr->Fptr->rowlength = lVar4;
          ffptbb(fptr,uVar5 - 2,lVar8,lVar4,local_2748,status);
          fptr->Fptr->rowlength = naxis1;
          uVar5 = uVar5 - 1;
        } while (2 < uVar5);
      }
    }
    else {
      lVar3 = (naxis1 + 9999) - bytepos;
      if (9999 < lVar3) {
        lVar3 = lVar3 / 10000;
        lVar8 = bytepos + lVar3 * 10000 + -9999;
        LVar9 = (naxis1 - lVar8) + 1;
        do {
          ffgtbb(fptr,naxis2,lVar8,LVar9,local_2748,status);
          fptr->Fptr->rowlength = lVar4;
          ffptbb(fptr,naxis2,ninsert + lVar8,LVar9,local_2748,status);
          pFVar7 = fptr->Fptr;
          pFVar7->rowlength = naxis1;
          lVar8 = lVar8 + -10000;
          LVar9 = 10000;
          lVar3 = lVar3 + -1;
        } while (lVar3 != 0);
      }
      if (1 < naxis2) {
        lVar3 = (naxis1 + 9999) / 10000;
        lVar8 = 1;
        if (1 < lVar3) {
          lVar8 = lVar3;
        }
        LVar9 = naxis2;
        do {
          lVar6 = LVar9 + -1;
          lVar10 = bytepos + lVar3 * 10000 + -9999;
          lVar11 = lVar8;
          nchars = naxis1 - (lVar3 * 10000 + -10000);
          if (0 < naxis1) {
            do {
              ffgtbb(fptr,lVar6,lVar10,nchars,local_2748,status);
              fptr->Fptr->rowlength = lVar4;
              ffptbb(fptr,lVar6,ninsert + lVar10,nchars,local_2748,status);
              pFVar7 = fptr->Fptr;
              pFVar7->rowlength = naxis1;
              lVar11 = lVar11 + -1;
              lVar10 = lVar10 + -10000;
              nchars = 10000;
            } while (lVar11 != 0);
          }
          bVar12 = 2 < LVar9;
          LVar9 = lVar6;
        } while (bVar12);
      }
      __n = 10000;
      if (ninsert < 10000) {
        __n = ninsert;
      }
      memset(local_2748,(uint)bVar1,__n);
      pFVar7->rowlength = lVar4;
      if (0 < naxis2) {
        lVar4 = (ninsert + 9999) / 10000;
        lVar3 = lVar4 * -10000;
        if (lVar4 < 2) {
          lVar4 = 1;
        }
        lVar8 = 1;
        do {
          lVar6 = lVar4;
          lVar10 = bytepos + 1;
          lVar11 = lVar3 + ninsert + 10000;
          if (0 < ninsert) {
            do {
              ffptbb(fptr,lVar8,lVar10,lVar11,local_2748,status);
              lVar6 = lVar6 + -1;
              lVar10 = lVar10 + lVar11;
              lVar11 = 10000;
            } while (lVar6 != 0);
          }
          bVar12 = lVar8 != naxis2;
          lVar8 = lVar8 + 1;
        } while (bVar12);
        pFVar7 = fptr->Fptr;
      }
      pFVar7->rowlength = naxis1;
    }
    iVar2 = *status;
  }
  return iVar2;
}

Assistant:

int ffcins(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG naxis1,     /* I - width of the table, in bytes             */
           LONGLONG naxis2,     /* I - number of rows in the table              */
           LONGLONG ninsert,    /* I - number of bytes to insert in each row    */
           LONGLONG bytepos,    /* I - rel. position in row to insert bytes     */
           int *status)     /* IO - error status                            */
/*
 Insert 'ninsert' bytes into each row of the table at position 'bytepos'.
*/
{
    unsigned char buffer[10000], cfill;
    LONGLONG newlen, fbyte, nbytes, irow, nseg, ii;

    if (*status > 0)
        return(*status);

    if (naxis2 == 0)
        return(*status);  /* just return if there are 0 rows in the table */

    /* select appropriate fill value */
    if ((fptr->Fptr)->hdutype == ASCII_TBL)
        cfill = 32;                     /* ASCII tables use blank fill */
    else
        cfill = 0;    /* primary array and binary tables use zero fill */

    newlen = naxis1 + ninsert;

    if (newlen <= 10000)
    {
       /*******************************************************************
       CASE #1: optimal case where whole new row fits in the work buffer
       *******************************************************************/

        for (ii = 0; ii < ninsert; ii++)
            buffer[ii] = cfill;      /* initialize buffer with fill value */

        /* first move the trailing bytes (if any) in the last row */
        fbyte = bytepos + 1;
        nbytes = naxis1 - bytepos;
        /* If the last row hasn't yet been accessed in full, it's possible
           that logfilesize hasn't been updated to account for it (by way
           of an ffldrc call).  This could cause ffgtbb to return with an
           EOF error.  To prevent this, we must increase logfilesize here. 
        */
        if ((fptr->Fptr)->logfilesize < (fptr->Fptr)->datastart + 
                 (fptr->Fptr)->heapstart)
        {
            (fptr->Fptr)->logfilesize = (((fptr->Fptr)->datastart +
                 (fptr->Fptr)->heapstart + 2879)/2880)*2880;
        }
        
        ffgtbb(fptr, naxis2, fbyte, nbytes, &buffer[ninsert], status);
        (fptr->Fptr)->rowlength = newlen; /*  new row length */

        /* write the row (with leading fill bytes) in the new place */
        nbytes += ninsert;
        ffptbb(fptr, naxis2, fbyte, nbytes, buffer, status);
        (fptr->Fptr)->rowlength = naxis1;  /* reset to orig. value */

        /*  now move the rest of the rows */
        for (irow = naxis2 - 1; irow > 0; irow--)
        {
            /* read the row to be shifted (work backwards thru the table) */
            ffgtbb(fptr, irow, fbyte, naxis1, &buffer[ninsert], status);
            (fptr->Fptr)->rowlength = newlen; /* new row length */

            /* write the row (with the leading fill bytes) in the new place */
            ffptbb(fptr, irow, fbyte, newlen, buffer, status);
            (fptr->Fptr)->rowlength = naxis1; /* reset to orig value */
        }
    }
    else
    {
        /*****************************************************************
        CASE #2:  whole row doesn't fit in work buffer; move row in pieces
        ******************************************************************
        first copy the data, then go back and write fill into the new column
        start by copying the trailing bytes (if any) in the last row.     */

        nbytes = naxis1 - bytepos;
        nseg = (nbytes + 9999) / 10000;
        fbyte = (nseg - 1) * 10000 + bytepos + 1;
        nbytes = naxis1 - fbyte + 1;

        for (ii = 0; ii < nseg; ii++)
        {
            ffgtbb(fptr, naxis2, fbyte, nbytes, buffer, status);
            (fptr->Fptr)->rowlength =   newlen;  /* new row length */

            ffptbb(fptr, naxis2, fbyte + ninsert, nbytes, buffer, status);
            (fptr->Fptr)->rowlength =   naxis1; /* reset to orig value */

            fbyte -= 10000;
            nbytes = 10000;
        }

        /* now move the rest of the rows */
        nseg = (naxis1 + 9999) / 10000;
        for (irow = naxis2 - 1; irow > 0; irow--)
        {
          fbyte = (nseg - 1) * 10000 + bytepos + 1;
          nbytes = naxis1 - (nseg - 1) * 10000;
          for (ii = 0; ii < nseg; ii++)
          { 
            /* read the row to be shifted (work backwards thru the table) */
            ffgtbb(fptr, irow, fbyte, nbytes, buffer, status);
            (fptr->Fptr)->rowlength =   newlen;  /* new row length */

            /* write the row in the new place */
            ffptbb(fptr, irow, fbyte + ninsert, nbytes, buffer, status);
            (fptr->Fptr)->rowlength =   naxis1; /* reset to orig value */

            fbyte -= 10000;
            nbytes = 10000;
          }
        }

        /* now write the fill values into the new column */
        nbytes = minvalue(ninsert, 10000);
        memset(buffer, cfill, (size_t) nbytes); /* initialize with fill value */

        nseg = (ninsert + 9999) / 10000;
        (fptr->Fptr)->rowlength =  newlen;  /* new row length */

        for (irow = 1; irow <= naxis2; irow++)
        {
          fbyte = bytepos + 1;
          nbytes = ninsert - ((nseg - 1) * 10000);
          for (ii = 0; ii < nseg; ii++)
          {
            ffptbb(fptr, irow, fbyte, nbytes, buffer, status);
            fbyte += nbytes;
            nbytes = 10000;
          }
        }
        (fptr->Fptr)->rowlength = naxis1;  /* reset to orig value */
    }
    return(*status);
}